

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

int __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::remove(basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
         *this,char *__filename)

{
  key_union *__first;
  byte bVar1;
  bool bVar2;
  int extraout_EAX;
  ulong uVar3;
  undefined1 local_40 [8];
  leaf_reclaimable_ptr r;
  
  bVar1 = (this->
          super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ).
          super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          .children_count.value;
  if (bVar1 <= (byte)__filename) {
    __assert_fail("child_index < children_count_",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x747,
                  "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  __first = &this->keys;
  bVar2 = std::is_sorted<unodb::in_fake_critical_section<std::byte>const*>
                    ((__first->byte_array)._M_elems,
                     (in_fake_critical_section<std::byte> *)
                     ((long)((this->children)._M_elems + -2) + (ulong)bVar1));
  if (bVar2) {
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )((this->children)._M_elems[(ulong)__filename & 0xff].value.tagged_ptr &
           0xfffffffffffffff8);
    uVar3 = (ulong)__filename & 0xff;
    while (uVar3 + 1 < (ulong)bVar1) {
      *(undefined1 *)((long)((this->children)._M_elems + -2) + uVar3) =
           *(undefined1 *)((long)(this->children)._M_elems + (uVar3 - 0xf));
      (this->children)._M_elems[uVar3].value.tagged_ptr =
           (this->children)._M_elems[uVar3 + 1].value.tagged_ptr;
      uVar3 = uVar3 + 1;
    }
    (this->
    super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
    ).
    super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
    .children_count.value = bVar1 - 1;
    bVar2 = std::is_sorted<unodb::in_fake_critical_section<std::byte>const*>
                      ((__first->byte_array)._M_elems,
                       (in_fake_critical_section<std::byte> *)
                       ((ulong)(byte)(bVar1 - 1) + (long)__first));
    if (bVar2) {
      std::
      unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_40);
      return extraout_EAX;
    }
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x757,
                  "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x749,
                "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

constexpr void remove(std::uint8_t child_index,
                        db_type &db_instance) noexcept {
    auto children_count_ = this->children_count.load();
    UNODB_DETAIL_ASSERT(child_index < children_count_);
    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));

    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        children[child_index].load().template ptr<leaf_type *>(), db_instance)};

    for (unsigned i = child_index + 1U; i < children_count_; ++i) {
      keys.byte_array[i - 1] = keys.byte_array[i];
      children[i - 1] = children[i];
    }

    --children_count_;
    this->children_count = children_count_;

    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));
  }